

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O0

void __thiscall
duckdb::InternalException::InternalException<short,unsigned_long,unsigned_long>
          (InternalException *this,string *msg,short params,unsigned_long params_1,
          unsigned_long params_2)

{
  unsigned_long in_RCX;
  undefined2 in_DX;
  undefined8 in_RSI;
  string *in_RDI;
  string local_48 [40];
  undefined6 in_stack_ffffffffffffffe8;
  
  Exception::ConstructMessage<short,unsigned_long,unsigned_long>
            (in_RDI,(short)((ulong)in_RSI >> 0x30),CONCAT26(in_DX,in_stack_ffffffffffffffe8),in_RCX)
  ;
  duckdb::InternalException::InternalException((InternalException *)in_RDI,local_48);
  std::__cxx11::string::~string(local_48);
  return;
}

Assistant:

explicit InternalException(const string &msg, ARGS... params)
	    : InternalException(ConstructMessage(msg, params...)) {
	}